

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementShellReissner4::ComputeNF(ChElementShellReissner4 *this)

{
  ChVectorDynamic<> *in_RCX;
  double *in_RDX;
  ChVectorDynamic<> *in_RSI;
  ChVectorDynamic<> *in_R8;
  ChVectorDynamic<> *in_R9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  ComputeNF((ChElementShellReissner4 *)
            (this[-1].stress_i[3].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
             m_storage.m_data.array + 10),in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_RSI,in_RDX,in_RCX,
            in_R8,in_R9);
  return;
}

Assistant:

void ChElementShellReissner4::ComputeNF(
    const double U,              // parametric coordinate in volume
    const double V,              // parametric coordinate in volume
    const double W,              // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
    ) {
    ShapeVector N;
    ShapeFunctions(N, U, V);

    detJ = GetLengthX() * GetLengthY() / 4.0;  // approximate
    detJ *= GetThickness();

    Qi.segment(0,3) = N(0) * F.segment(0,3);
    Qi.segment(3,3) = N(0) * F.segment(3,3);

    Qi.segment(6, 3) = N(1) * F.segment(0, 3);
    Qi.segment(9, 3) = N(1) * F.segment(3, 3);

    Qi.segment(12, 3) = N(2) * F.segment(0, 3);
    Qi.segment(15, 3) = N(2) * F.segment(3, 3);

    Qi.segment(18, 3) = N(3) * F.segment(0, 3);
    Qi.segment(21, 3) = N(3) * F.segment(3, 3);
}